

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixCheckReservedLock(sqlite3_file *id,int *pResOut)

{
  sqlite3_mutex *psVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  flock lock;
  
  psVar1 = (sqlite3_mutex *)(id[2].pMethods)->xRead;
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar1);
  }
  if (*(byte *)&(id[2].pMethods)->xTruncate < 2) {
    iVar5 = 0;
    iVar4 = 0;
    if (*(char *)((long)&(id[2].pMethods)->xTruncate + 1) == '\0') {
      iVar5 = 0;
      iVar2 = (*aSyscall[7].pCurrent)((ulong)*(uint *)&id[3].pMethods,5);
      if (iVar2 == 0) {
        iVar5 = 1;
      }
      else {
        piVar3 = __errno_location();
        *(int *)&id[4].pMethods = *piVar3;
        iVar4 = 0xe0a;
      }
    }
  }
  else {
    iVar4 = 0;
    iVar5 = 1;
  }
  psVar1 = (sqlite3_mutex *)(id[2].pMethods)->xRead;
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar1);
  }
  *pResOut = iVar5;
  return iVar4;
}

Assistant:

static int unixCheckReservedLock(sqlite3_file *id, int *pResOut){
  int rc = SQLITE_OK;
  int reserved = 0;
  unixFile *pFile = (unixFile*)id;

  SimulateIOError( return SQLITE_IOERR_CHECKRESERVEDLOCK; );

  assert( pFile );
  assert( pFile->eFileLock<=SHARED_LOCK );
  sqlite3_mutex_enter(pFile->pInode->pLockMutex);

  /* Check if a thread in this process holds such a lock */
  if( pFile->pInode->eFileLock>SHARED_LOCK ){
    reserved = 1;
  }

  /* Otherwise see if some other process holds it.
  */
#ifndef __DJGPP__
  if( !reserved && !pFile->pInode->bProcessLock ){
    struct flock lock;
    lock.l_whence = SEEK_SET;
    lock.l_start = RESERVED_BYTE;
    lock.l_len = 1;
    lock.l_type = F_WRLCK;
    if( osFcntl(pFile->h, F_GETLK, &lock) ){
      rc = SQLITE_IOERR_CHECKRESERVEDLOCK;
      storeLastErrno(pFile, errno);
    } else if( lock.l_type!=F_UNLCK ){
      reserved = 1;
    }
  }
#endif
  
  sqlite3_mutex_leave(pFile->pInode->pLockMutex);
  OSTRACE(("TEST WR-LOCK %d %d %d (unix)\n", pFile->h, rc, reserved));

  *pResOut = reserved;
  return rc;
}